

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ciphersuites.c
# Opt level: O0

int * mbedtls_ssl_list_ciphersuites(void)

{
  mbedtls_ssl_ciphersuite_t *pmVar1;
  mbedtls_ssl_ciphersuite_t *cs_info;
  int *q;
  int *p;
  
  if (supported_init == 0) {
    cs_info = (mbedtls_ssl_ciphersuite_t *)supported_ciphersuites;
    for (q = ciphersuite_preference;
        *q != 0 && cs_info <= (mbedtls_ssl_ciphersuite_t *)((long)supported_ciphersuites + 0x22fU);
        q = q + 1) {
      pmVar1 = mbedtls_ssl_ciphersuite_from_id(*q);
      if ((pmVar1 != (mbedtls_ssl_ciphersuite_t *)0x0) &&
         (pmVar1->cipher != MBEDTLS_CIPHER_ARC4_128)) {
        cs_info->id = *q;
        cs_info = (mbedtls_ssl_ciphersuite_t *)&cs_info->field_0x4;
      }
    }
    cs_info->id = 0;
    supported_init = 1;
  }
  return supported_ciphersuites;
}

Assistant:

const int *mbedtls_ssl_list_ciphersuites( void )
{
    /*
     * On initial call filter out all ciphersuites not supported by current
     * build based on presence in the ciphersuite_definitions.
     */
    if( supported_init == 0 )
    {
        const int *p;
        int *q;

        for( p = ciphersuite_preference, q = supported_ciphersuites;
             *p != 0 && q < supported_ciphersuites + MAX_CIPHERSUITES - 1;
             p++ )
        {
#if defined(MBEDTLS_REMOVE_ARC4_CIPHERSUITES)
            const mbedtls_ssl_ciphersuite_t *cs_info;
            if( ( cs_info = mbedtls_ssl_ciphersuite_from_id( *p ) ) != NULL &&
                cs_info->cipher != MBEDTLS_CIPHER_ARC4_128 )
#else
            if( mbedtls_ssl_ciphersuite_from_id( *p ) != NULL )
#endif
                *(q++) = *p;
        }
        *q = 0;

        supported_init = 1;
    }

    return( supported_ciphersuites );
}